

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::doCreate(Forth *this)

{
  Cell index;
  Definition *pDVar1;
  char *name;
  Xt defn;
  Forth *this_local;
  
  index = this->executingWord;
  pDVar1 = definitionsAt(this,index);
  name = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                   (&pDVar1->name);
  requireDStackAvailable(this,1,name);
  pDVar1 = definitionsAt(this,index);
  push(this,pDVar1->parameter);
  return;
}

Assistant:

void doCreate() {
			auto defn = executingWord;
			REQUIRE_DSTACK_AVAILABLE(1, definitionsAt(defn).name.c_str());
			push(CELL(definitionsAt(defn).parameter)); 
		}